

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

void __thiscall icu_63::MeasureUnit::initNoUnit(MeasureUnit *this,char *subtype)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar5 = 0x14;
  do {
    while( true ) {
      if (iVar5 <= iVar4) {
        iVar3 = -1;
        goto LAB_002533e1;
      }
      iVar3 = (iVar4 + iVar5) / 2;
      iVar1 = strcmp(*(char **)(gTypes + (long)iVar3 * 8),"none");
      if (-1 < iVar1) break;
      iVar4 = iVar3 + 1;
    }
    iVar5 = iVar3;
  } while (iVar1 != 0);
LAB_002533e1:
  this->fTypeId = iVar3;
  iVar4 = (&gOffsets)[iVar3];
  iVar5 = iVar4;
  iVar3 = (&DAT_0031cde4)[iVar3];
  do {
    while( true ) {
      if (iVar3 <= iVar5) {
        iVar1 = -1;
        goto LAB_00253441;
      }
      iVar1 = (iVar3 + iVar5) / 2;
      iVar2 = strcmp(*(char **)(gSubTypes + (long)iVar1 * 8),subtype);
      if (-1 < iVar2) break;
      iVar5 = iVar1 + 1;
    }
    iVar3 = iVar1;
  } while (iVar2 != 0);
LAB_00253441:
  this->fSubTypeId = iVar1 - iVar4;
  return;
}

Assistant:

void MeasureUnit::initNoUnit(const char *subtype) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "none");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], subtype);
    U_ASSERT(result != -1);
    fSubTypeId = result - gOffsets[fTypeId];
}